

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

void __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::skip_ws(input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this)

{
  uint uVar1;
  FILE *in_RSI;
  
  do {
    uVar1 = getc(this,in_RSI);
    if (0x20 < uVar1) break;
  } while ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0);
  if (this->last_ch_ != -1) {
    if (this->ungot_ == true) {
      __assert_fail("! ungot_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/deoxxa[P]mitsukeru/vendor/picojson.h"
                    ,0x157,
                    "void picojson::input<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::ungetc() [Iter = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>]"
                   );
    }
    this->ungot_ = true;
  }
  return;
}

Assistant:

void skip_ws() {
      while (1) {
	int ch = getc();
	if (! (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r')) {
	  ungetc();
	  break;
	}
      }
    }